

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O3

void __thiscall CJSONException::CJSONException(CJSONException *this,string *Msg,JSONErrorType Type)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__CJSONException_00141d38;
  (this->m_Msg)._M_dataplus._M_p = (pointer)&(this->m_Msg).field_2;
  pcVar1 = (Msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_Msg,pcVar1,pcVar1 + Msg->_M_string_length);
  this->m_ErrType = Type;
  return;
}

Assistant:

CJSONException(const std::string &Msg, JSONErrorType Type) : m_Msg(Msg), m_ErrType(Type) {}